

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

sexp_conflict
sexp_25_make_address_info_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2,sexp_conflict arg3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  addrinfo *r;
  int local_90;
  int local_88;
  int local_80;
  int local_78;
  int local_70;
  int local_68;
  int local_60;
  int local_58;
  sexp_conflict *local_50;
  undefined8 local_48;
  sexp_conflict local_40;
  int *local_38;
  int *local_30;
  int *local_28;
  int *local_20;
  long local_10;
  long local_8;
  
  local_40 = (sexp_conflict)0x43e;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_50,0,0x10);
  local_50 = &local_40;
  local_48 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp_conflict ***)(local_8 + 0x6080) = &local_50;
  auVar1._8_8_ = (long)*(ulong *)(local_10 + 0x28) >> 0x3f;
  auVar1._0_8_ = *(ulong *)(local_10 + 0x28) & 0xfffffffffffffffe;
  local_40 = (sexp_conflict)sexp_alloc_tagged_aux(local_8,0x20,SUB168(auVar1 / SEXT816(2),0));
  pvVar6 = calloc(1,0x30);
  (local_40->value).cpointer.value = pvVar6;
  local_38 = (int *)(local_40->value).cpointer.value;
  memset(local_38,0,0x30);
  local_40->field_0x5 = local_40->field_0x5 & 0xfd | 2;
  if (((ulong)local_20 & 1) == 1) {
    auVar2._8_8_ = (long)local_20 >> 0x3f;
    auVar2._0_8_ = (ulong)local_20 & 0xfffffffffffffffe;
    local_58 = SUB164(auVar2 / SEXT816(2),0);
  }
  else {
    if ((((ulong)local_20 & 3) == 0) && (*local_20 == 0xc)) {
      local_60 = (int)(char)local_20[2] * (int)*(undefined8 *)(local_20 + 6);
    }
    else {
      local_60 = 0;
    }
    local_58 = local_60;
  }
  local_38[1] = local_58;
  if (((ulong)local_28 & 1) == 1) {
    auVar3._8_8_ = (long)local_28 >> 0x3f;
    auVar3._0_8_ = (ulong)local_28 & 0xfffffffffffffffe;
    local_68 = SUB164(auVar3 / SEXT816(2),0);
  }
  else {
    if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0xc)) {
      local_70 = (int)(char)local_28[2] * (int)*(undefined8 *)(local_28 + 6);
    }
    else {
      local_70 = 0;
    }
    local_68 = local_70;
  }
  local_38[2] = local_68;
  if (((ulong)local_30 & 1) == 1) {
    auVar4._8_8_ = (long)local_30 >> 0x3f;
    auVar4._0_8_ = (ulong)local_30 & 0xfffffffffffffffe;
    local_78 = SUB164(auVar4 / SEXT816(2),0);
  }
  else {
    if ((((ulong)local_30 & 3) == 0) && (*local_30 == 0xc)) {
      local_80 = (int)(char)local_30[2] * (int)*(undefined8 *)(local_30 + 6);
    }
    else {
      local_80 = 0;
    }
    local_78 = local_80;
  }
  local_38[3] = local_78;
  if (((ulong)in_stack_00000008 & 1) == 1) {
    auVar5._8_8_ = (long)in_stack_00000008 >> 0x3f;
    auVar5._0_8_ = (ulong)in_stack_00000008 & 0xfffffffffffffffe;
    local_88 = SUB164(auVar5 / SEXT816(2),0);
  }
  else {
    if ((((ulong)in_stack_00000008 & 3) == 0) && (*in_stack_00000008 == 0xc)) {
      local_90 = (int)(char)in_stack_00000008[2] * (int)*(undefined8 *)(in_stack_00000008 + 6);
    }
    else {
      local_90 = 0;
    }
    local_88 = local_90;
  }
  *local_38 = local_88;
  *(undefined8 *)(local_8 + 0x6080) = local_48;
  return local_40;
}

Assistant:

sexp sexp_25_make_address_info_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2, sexp arg3) {
  struct addrinfo* r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_tagged(ctx, sexp_sizeof(cpointer), sexp_unbox_fixnum(sexp_opcode_return_type(self)));
  sexp_cpointer_value(res) = calloc(1, sizeof(struct addrinfo));
  r = (struct addrinfo*) sexp_cpointer_value(res);
  memset(r, 0, sizeof(struct addrinfo));
  sexp_freep(res) = 1;
  r->ai_family = sexp_sint_value(arg0);
  r->ai_socktype = sexp_sint_value(arg1);
  r->ai_protocol = sexp_sint_value(arg2);
  r->ai_flags = sexp_sint_value(arg3);
  sexp_gc_release1(ctx);
  return res;
}